

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2BufferSharingTest::createResource(GLES2BufferSharingTest *this)

{
  pointer puVar1;
  deUint32 dVar2;
  GLenum GVar3;
  int iVar4;
  uchar local_29;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&this->m_buffer,0x400);
  iVar4 = 0x400;
  do {
    dVar2 = deRandom_getUint32(&(this->super_GLES2SharingTest).m_random.m_rnd);
    local_29 = (uchar)dVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_buffer,&local_29);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  (*(this->super_GLES2SharingTest).m_gl.genBuffers)(1,&this->m_glBuffer);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"genBuffers(1, &m_glBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x144);
  (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,this->m_glBuffer);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"bindBuffer(GL_ARRAY_BUFFER, m_glBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x145);
  puVar1 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (*(this->super_GLES2SharingTest).m_gl.bufferData)
            (0x8892,(long)(*(int *)&(this->m_buffer).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1),puVar1
             ,0x88e8);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,
                  "bufferData(GL_ARRAY_BUFFER, (GLsizei)(m_buffer.size() * sizeof(GLubyte)), &(m_buffer[0]), GL_DYNAMIC_DRAW)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x146);
  (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,0);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x147);
  return;
}

Assistant:

void GLES2BufferSharingTest::createResource (void)
{
	int						size	= 16*16*4;

	m_buffer.reserve(size);

	for (int i = 0; i < size; i++)
		m_buffer.push_back((GLubyte)m_random.getInt(0, 255));

	GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_glBuffer));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_glBuffer));
	GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (GLsizei)(m_buffer.size() * sizeof(GLubyte)), &(m_buffer[0]), GL_DYNAMIC_DRAW));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, 0));
}